

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Reduce_scatter_block
              (void *sendbuf,void *recvbuf,int recvcount,MPIABI_Datatype datatype,MPIABI_Op op,
              MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Reduce_scatter_block();
  return iVar1;
}

Assistant:

int MPIABI_Reduce_scatter_block(
  const void * sendbuf,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype datatype,
  MPIABI_Op op,
  MPIABI_Comm comm
) {
  return MPI_Reduce_scatter_block(
    sendbuf,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Comm)(WPI_Comm)comm
  );
}